

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int walIndexPageRealloc(Wal *pWal,int iPage,u32 **ppPage)

{
  long lVar1;
  int iVar2;
  u32 **ppuVar3;
  u32 *puVar4;
  
  if (pWal->nWiData <= iPage) {
    lVar1 = (long)iPage + 1;
    iVar2 = (int)lVar1;
    ppuVar3 = (u32 **)sqlite3_realloc64(pWal->apWiData,(long)iVar2 << 3);
    if (ppuVar3 == (u32 **)0x0) {
      iVar2 = 7;
      puVar4 = (u32 *)0x0;
      goto LAB_001322de;
    }
    memset(ppuVar3 + pWal->nWiData,0,(lVar1 - pWal->nWiData) * 8);
    pWal->apWiData = ppuVar3;
    pWal->nWiData = iVar2;
  }
  if (pWal->exclusiveMode == '\x02') {
    puVar4 = (u32 *)sqlite3MallocZero(0x8000);
    pWal->apWiData[iPage] = puVar4;
    iVar2 = 7;
    if (pWal->apWiData[iPage] != (u32 *)0x0) {
      iVar2 = 0;
    }
  }
  else {
    iVar2 = (*pWal->pDbFd->pMethods->xShmMap)
                      (pWal->pDbFd,iPage,0x8000,(int)pWal->writeLock,pWal->apWiData + iPage);
    if ((char)iVar2 == '\b') {
      pWal->readOnly = pWal->readOnly | 2;
      if (iVar2 == 8) {
        iVar2 = 0;
      }
    }
  }
  puVar4 = pWal->apWiData[iPage];
LAB_001322de:
  *ppPage = puVar4;
  return iVar2;
}

Assistant:

static SQLITE_NOINLINE int walIndexPageRealloc(
  Wal *pWal,               /* The WAL context */
  int iPage,               /* The page we seek */
  volatile u32 **ppPage    /* Write the page pointer here */
){
  int rc = SQLITE_OK;

  /* Enlarge the pWal->apWiData[] array if required */
  if( pWal->nWiData<=iPage ){
    sqlite3_int64 nByte = sizeof(u32*)*(iPage+1);
    volatile u32 **apNew;
    apNew = (volatile u32 **)sqlite3_realloc64((void *)pWal->apWiData, nByte);
    if( !apNew ){
      *ppPage = 0;
      return SQLITE_NOMEM_BKPT;
    }
    memset((void*)&apNew[pWal->nWiData], 0,
           sizeof(u32*)*(iPage+1-pWal->nWiData));
    pWal->apWiData = apNew;
    pWal->nWiData = iPage+1;
  }

  /* Request a pointer to the required page from the VFS */
  assert( pWal->apWiData[iPage]==0 );
  if( pWal->exclusiveMode==WAL_HEAPMEMORY_MODE ){
    pWal->apWiData[iPage] = (u32 volatile *)sqlite3MallocZero(WALINDEX_PGSZ);
    if( !pWal->apWiData[iPage] ) rc = SQLITE_NOMEM_BKPT;
  }else{
    rc = sqlite3OsShmMap(pWal->pDbFd, iPage, WALINDEX_PGSZ, 
        pWal->writeLock, (void volatile **)&pWal->apWiData[iPage]
    );
    assert( pWal->apWiData[iPage]!=0 || rc!=SQLITE_OK || pWal->writeLock==0 );
    testcase( pWal->apWiData[iPage]==0 && rc==SQLITE_OK );
    if( (rc&0xff)==SQLITE_READONLY ){
      pWal->readOnly |= WAL_SHM_RDONLY;
      if( rc==SQLITE_READONLY ){
        rc = SQLITE_OK;
      }
    }
  }

  *ppPage = pWal->apWiData[iPage];
  assert( iPage==0 || *ppPage || rc!=SQLITE_OK );
  return rc;
}